

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_outpoint.cpp
# Opt level: O3

void __thiscall OutPoint_OutPointEmpty_Test::TestBody(OutPoint_OutPointEmpty_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_2;
  OutPoint outpoint;
  AssertHelper local_a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  Txid local_90;
  string local_70;
  AssertHelper local_50;
  int local_44;
  OutPoint local_40;
  
  cfd::core::OutPoint::OutPoint(&local_40);
  cfd::core::OutPoint::GetTxid(&local_90,&local_40);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_70,&local_90);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a0,"outpoint.GetTxid().GetHex().c_str()","\"\"",
             local_70._M_dataplus._M_p,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_90._vptr_Txid = (_func_int **)&PTR__Txid_00678d28;
  if (local_90.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_98.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_98.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x10,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::OutPoint::GetTxid((Txid *)&local_70,&local_40);
  cfd::core::Txid::GetData((ByteData *)&local_90,(Txid *)&local_70);
  local_50.data_ = (AssertHelperData *)cfd::core::ByteData::GetDataSize((ByteData *)&local_90);
  local_44 = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a0,"outpoint.GetTxid().GetData().GetDataSize()","0",
             (unsigned_long *)&local_50,&local_44);
  if (local_90._vptr_Txid != (_func_int **)0x0) {
    operator_delete(local_90._vptr_Txid);
  }
  local_70._M_dataplus._M_p = (pointer)&PTR__Txid_00678d28;
  if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
    operator_delete((void *)local_70._M_string_length);
  }
  if (local_a0.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_98.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_98.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x11,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if ((undefined **)local_70._M_dataplus._M_p != (undefined **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((undefined **)local_70._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_70._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar2 = cfd::core::OutPoint::GetVout(&local_40);
  local_90._vptr_Txid = (_func_int **)CONCAT44(local_90._vptr_Txid._4_4_,uVar2);
  local_a0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_70,"outpoint.GetVout()","0",(uint *)&local_90,(int *)&local_a0);
  if ((char)local_70._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_90);
    if ((undefined8 *)local_70._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_70._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x12,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_90._vptr_Txid != (_func_int **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_90._vptr_Txid != (_func_int **)0x0)) {
        (**(code **)(*local_90._vptr_Txid + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_70._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = cfd::core::OutPoint::IsValid(&local_40);
  local_90._vptr_Txid = (_func_int **)CONCAT71(local_90._vptr_Txid._1_7_,!bVar1);
  local_90.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&local_90,(AssertionResult *)0x544795,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_outpoint.cpp"
               ,0x13,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (CONCAT44(local_a0.data_._4_4_,local_a0.data_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT44(local_a0.data_._4_4_,local_a0.data_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,local_a0.data_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_40.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00678d28;
  if (local_40.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(OutPoint, OutPointEmpty) {
  OutPoint outpoint;
  EXPECT_STREQ(outpoint.GetTxid().GetHex().c_str(), "");
  EXPECT_EQ(outpoint.GetTxid().GetData().GetDataSize(), 0);
  EXPECT_EQ(outpoint.GetVout(), 0);
  EXPECT_FALSE(outpoint.IsValid());
}